

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O3

void __thiscall
llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
moveConstruct<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
           *this,ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                 *Other)

{
  undefined8 uVar1;
  undefined4 uVar2;
  
  if ((Other->field_0x10 & 1) == 0) {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] & 0xfe);
    if ((Other->field_0x10 & 1) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/ErrorOr.h"
                    ,0xf3,
                    "storage_type *llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                   );
    }
    *(undefined8 *)this = *(undefined8 *)(Other->field_0).TStorage.buffer;
    *(undefined8 *)(Other->field_0).TStorage.buffer = 0;
  }
  else {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] | 1);
    if ((Other->field_0x10 & 1) == 0) {
      uVar2 = 0;
      uVar1 = std::_V2::system_category();
    }
    else {
      uVar2 = *(undefined4 *)&Other->field_0;
      uVar1 = *(undefined8 *)((long)&Other->field_0 + 8);
    }
    *(undefined4 *)this = uVar2;
    *(undefined8 *)(this + 8) = uVar1;
  }
  return;
}

Assistant:

void moveConstruct(ErrorOr<OtherT> &&Other) {
    if (!Other.HasError) {
      // Get the other value.
      HasError = false;
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    } else {
      // Get other's error.
      HasError = true;
      new (getErrorStorage()) std::error_code(Other.getError());
    }
  }